

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O2

void pzgeom::TPZGeoTriangle::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  TPZGeoNode *this;
  int j;
  long lVar4;
  long lVar5;
  int i_1;
  int64_t index;
  double local_118;
  TPZManVector<double,_3> co;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> scale;
  TPZManVector<double,_3> shift;
  
  TPZManVector<double,_3>::TPZManVector(&co,3);
  TPZManVector<double,_3>::TPZManVector(&shift,3);
  TPZManVector<double,_3>::TPZManVector(&scale,3);
  TPZManVector<long,_3>::TPZManVector(&nodeindexes,3);
  pdVar1 = size->fStore;
  pdVar2 = lowercorner->fStore;
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    scale.super_TPZVec<double>.fStore[lVar5] = pdVar1[lVar5] / 3.0;
    shift.super_TPZVec<double>.fStore[lVar5] = pdVar2[lVar5] + 0.5;
  }
  for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
    pztopology::TPZTriangle::ParametricDomainNodeCoord((int)lVar5,&co.super_TPZVec<double>);
    index = 0;
    TPZManVector<double,_3>::Resize(&co,3,(double *)&index);
    for (lVar4 = 0; lVar4 < co.super_TPZVec<double>.fNElements; lVar4 = lVar4 + 1) {
      local_118 = scale.super_TPZVec<double>.fStore[lVar4] * co.super_TPZVec<double>.fStore[lVar4] +
                  shift.super_TPZVec<double>.fStore[lVar4];
      iVar3 = rand();
      co.super_TPZVec<double>.fStore[lVar4] =
           ((double)iVar3 * 0.2) / 2147483647.0 + local_118 + -0.1;
    }
    iVar3 = TPZAdmChunkVector<TPZGeoNode,_10>::AllocateNewElement(&gmesh->fNodeVec);
    nodeindexes.super_TPZVec<long>.fStore[lVar5] = (long)iVar3;
    this = TPZChunkVector<TPZGeoNode,_10>::operator[]
                     (&(gmesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,(long)iVar3);
    TPZGeoNode::Initialize(this,&co.super_TPZVec<double>,gmesh);
  }
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xc])
            (gmesh,2,&nodeindexes,(ulong)(uint)matid,&index,1);
  TPZManVector<long,_3>::~TPZManVector(&nodeindexes);
  TPZManVector<double,_3>::~TPZManVector(&scale);
  TPZManVector<double,_3>::~TPZManVector(&shift);
  TPZManVector<double,_3>::~TPZManVector(&co);
  return;
}

Assistant:

void TPZGeoTriangle::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
    {
        TPZManVector<REAL,3> co(3),shift(3),scale(3);
        TPZManVector<int64_t,3> nodeindexes(3);
        for (int i=0; i<3; i++) {
            scale[i] = size[i]/3.;
            shift[i] = 1./2.+lowercorner[i];
        }
        
        for (int i=0; i<NCornerNodes; i++) {
            ParametricDomainNodeCoord(i, co);
            co.Resize(3, 0.);
            for (int j=0; j<co.size(); j++) {
                co[j] = shift[j]+scale[j]*co[j]+(rand()*0.2/RAND_MAX)-0.1;
            }
            nodeindexes[i] = gmesh.NodeVec().AllocateNewElement();
            gmesh.NodeVec()[nodeindexes[i]].Initialize(co, gmesh);
        }
        int64_t index;
        gmesh.CreateGeoElement(ETriangle, nodeindexes, matid, index);
    }